

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertions.h
# Opt level: O1

void cgreen::assert_that_<unsigned_long>
               (char *file,int line,char *actual_string,unsigned_long actual,Constraint *constraint)

{
  char *__s1;
  int iVar1;
  unsigned_long local_38;
  
  __s1 = _xmlChildElementCount;
  local_38 = actual;
  if (_xmlChildElementCount != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") {
    if (*_xmlChildElementCount == '*') {
      if (_xmlChildElementCount == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE")
      goto LAB_0010c0d2;
    }
    else {
      iVar1 = strcmp(_xmlChildElementCount,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010c0d2;
    }
    if (*__s1 == '*') {
      if (__s1 == "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") goto LAB_0010c0d2;
    }
    else {
      iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010c0d2;
    }
    if (*__s1 == '*') {
      if (__s1 == "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") goto LAB_0010c0d2;
    }
    else {
      iVar1 = strcmp(__s1,"PKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      if ((__s1 == "PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") || (iVar1 == 0))
      goto LAB_0010c0d2;
    }
    if ((*__s1 == '*') ||
       (iVar1 = strcmp(__s1,"PNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar1 != 0)) {
      if ((__s1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
         ((*__s1 == '*' ||
          (iVar1 = strcmp(__s1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"), iVar1 != 0))
         )) {
        cgreen::assert_that_(file,line,actual_string,actual,constraint);
        return;
      }
      cgreen::assert_that_(file,line,actual_string,(string *)&local_38,constraint);
      return;
    }
  }
LAB_0010c0d2:
  cgreen::assert_that_(file,line,actual_string,(string *)actual,constraint);
  return;
}

Assistant:

void assert_that_(const char *file, int line, const char *actual_string, T actual, Constraint *constraint) {

        if (typeid(actual) == typeid(std::string&) ||
            typeid(actual) == typeid(const std::string&) ||
            typeid(actual) == typeid(const std::string*) ||
            typeid(actual) == typeid(std::string*)) {

            assert_that_(file, line, actual_string, reinterpret_cast<const std::string *>(actual), constraint);

        } else if (typeid(actual) == typeid(std::string)) {

            assert_that_(file, line, actual_string, (const std::string *)&actual, constraint);

        } else {
            // TODO: update actual_string with output from operator<< of (T)actual
            assert_that_(file, line, actual_string, (intptr_t)actual, constraint);
        }
    }